

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O1

void visualize_help(char *name)

{
  printf("usage: \n %s visualize input_mesh.extension input_solution.extension output_solution.extension\n"
         ,name);
  putchar(10);
  puts(
      "  input_solution.extension or output_solution.extension can be \'none\'.\n  input_solution.extension can be \'degree\'."
      );
  puts("  options:");
  puts("   --surface extracts surface elements (deletes volume).");
  puts("   --subtract <baseline_solution.extension> computes (input-baseline).");
  puts("   --iso <0-based variable index> <threshold> <iso.extension> extracts an isosurface.");
  puts("   --slice <nx> <ny> <nz> <offset> <slice.extension> extracts a slice.");
  puts(
      "   --boomray <x0> <y0> <z0> <x1> <y1> <z1> <ray.tec> extracts a ray\n      of dp/pinf defined by two points."
      );
  putchar(10);
  return;
}

Assistant:

static void visualize_help(const char *name) {
  printf(
      "usage: \n %s visualize input_mesh.extension input_solution.extension "
      "output_solution.extension\n",
      name);
  printf("\n");
  printf(
      "  input_solution.extension or output_solution.extension "
      "can be 'none'.\n  input_solution.extension can be 'degree'.\n");
  printf("  options:\n");
  printf("   --surface extracts surface elements (deletes volume).\n");
  printf(
      "   --subtract <baseline_solution.extension> "
      "computes (input-baseline).\n");
  printf(
      "   --iso <0-based variable index> <threshold> <iso.extension> "
      "extracts an isosurface.\n");
  printf(
      "   --slice <nx> <ny> <nz> <offset> <slice.extension> "
      "extracts a slice.\n");
  printf(
      "   --boomray <x0> <y0> <z0> <x1> <y1> <z1> <ray.tec> "
      "extracts a ray\n      of dp/pinf defined by two points.\n");

  printf("\n");
}